

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraALU_cpp.h
# Opt level: O0

u32 __thiscall moira::Moira::divuMusashi<(moira::Core)0>(Moira *this,u32 op1,u32 op2)

{
  ulong data;
  bool bVar1;
  u16 remainder;
  i64 quotient;
  u32 result;
  u32 op2_local;
  u32 op1_local;
  Moira *this_local;
  
  data = (ulong)op1 / (ulong)op2;
  if (data < 0x10000) {
    quotient._4_4_ = (uint)data & 0xffff | op1 % op2 << 0x10;
    (this->reg).sr.z = data != 0;
    bVar1 = NBIT<2>(data);
    (this->reg).sr.n = bVar1;
    (this->reg).sr.v = false;
    (this->reg).sr.c = false;
  }
  else {
    (this->reg).sr.v = true;
    quotient._4_4_ = op1;
  }
  return quotient._4_4_;
}

Assistant:

u32
Moira::divuMusashi(u32 op1, u32 op2)
{
    u32 result;
    i64 quotient  = op1 / op2;
    u16 remainder = (u16)(op1 % op2);

    if(quotient < 0x10000) {

        result = (quotient & 0xffff) | remainder << 16;

        reg.sr.z = quotient;
        reg.sr.n = NBIT<Word>(quotient);
        reg.sr.v = 0;
        reg.sr.c = 0;

    } else {

        result = op1;
        reg.sr.v = 1;
    }

    return result;
}